

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  shared_ptr<Common::WriteToConsoleListener> writeToConsoleListener;
  shared_ptr<SteppingZomby::Zomby> steppingZomby;
  __shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  __shared_ptr<Common::Listener,(__gnu_cxx::_Lock_policy)2> local_1e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  duration<long,_std::ratio<1L,_1000L>_> local_1d8 [4];
  undefined1 local_1b8 [40];
  duration<long,_std::ratio<1L,_1000L>_> local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188 [46];
  
  Common::WriteToConsoleListener::instance();
  SteppingZomby::Zomby::create();
  std::__shared_ptr<Common::Listener,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Common::WriteToConsoleListener,void>(local_1e8,&local_1f8);
  SteppingZomby::Zomby::runOnce((Zomby *)local_190.__r,(shared_ptr<Common::Listener> *)local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0);
  local_1d8[0].__r = 0x5dc;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(local_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_188);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  poVar1 = std::operator<<((ostream *)&local_190,
                           "============================================================\n");
  poVar1 = std::operator<<(poVar1,"|                      Zomby was killed                    |\n");
  std::operator<<(poVar1,"============================================================\n");
  if (local_1f8._M_ptr != (WriteToConsoleListener *)0x0) {
    std::__cxx11::stringbuf::str();
    std::make_shared<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    local_1b8._16_8_ = local_1b8._0_8_;
    local_1b8._24_8_ = local_1b8._8_8_;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = 0;
    Common::WriteToConsoleListener::processData
              (local_1f8._M_ptr,
               (shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_1b8 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 0x18));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
    std::__cxx11::string::~string((string *)local_1d8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  local_190.__r = 5000;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
  return 0;
}

Assistant:

int main()
{
    auto writeToConsoleListener = Common::WriteToConsoleListener::instance();

    {
        auto steppingZomby = SteppingZomby::Zomby::create();
        steppingZomby->runOnce(writeToConsoleListener);

        std::this_thread::sleep_for(std::chrono::milliseconds(1500));
    } // Zombies should be killed here

    {
        std::ostringstream buf;
        buf << "============================================================\n"
            << "|                      Zomby was killed                    |\n"
            << "============================================================\n";
        if (writeToConsoleListener) {
            writeToConsoleListener->processData(std::make_shared<Common::Listener::Data>(buf.str()));
        }
    }

    std::this_thread::sleep_for(std::chrono::milliseconds(5000));

    return 0;
}